

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

void ws::log_helper<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
               (Severity severity,FormatWithLoc *fmt,char (*args) [7],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               char (*args_2) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  pointer pcVar1;
  time_point time_point_;
  Record rec;
  string local_90;
  Record local_70;
  
  get_logger_instance();
  if (get_logger_instance::instance.mode != none) {
    time_point_.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Record::Record(&local_70,time_point_,severity,(fmt->loc)._M_impl);
    pcVar1 = (fmt->fmt)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + (fmt->fmt)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_70.message,*args);
      Record::add_helper<std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
                (&local_70,args_1,args_2,args_3);
    }
    else {
      pcVar1 = (fmt->fmt)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + (fmt->fmt)._M_string_length);
      Record::
      add_fmt<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
                (&local_70,&local_90,args,args_1,args_2,args_3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    get_logger_instance();
    Logger::add(&get_logger_instance::instance,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.message._M_dataplus._M_p != &local_70.message.field_2) {
      operator_delete(local_70.message._M_dataplus._M_p,
                      local_70.message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void log_helper(Severity severity, const FormatWithLoc &fmt, Args &&...args)
  {
    if (get_logger_instance().get_mode() == Output::none)
    {
      return;
    }
    Record rec(std::chrono::system_clock::now(), severity, fmt.get_loc());
    if (fmt.get_fmt().empty())
    {
      rec.add(std::forward<Args>(args)...);
    }
    else
    {
      rec.add_fmt(fmt.get_fmt(), std::forward<Args>(args)...);
    }
    get_logger_instance().add(rec);
  }